

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.hpp
# Opt level: O3

void __thiscall
boost::xpressive::detail::
dynamic_xpression<boost::xpressive::detail::assert_word_matcher<boost::xpressive::detail::word_boundary<mpl_::bool_<true>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::repeat_(undefined8 param_1,undefined8 param_2,long seq)

{
  undefined **local_60 [2];
  undefined **local_50;
  refcount_ptr<boost::exception_detail::error_info_container> local_48;
  char *pcStack_40;
  char *local_38;
  undefined8 local_30;
  error_type local_28;
  source_location local_20;
  
  if (*(int *)(seq + 0x10) != 0) {
    repeat_();
    return;
  }
  std::runtime_error::runtime_error((runtime_error *)local_60,"expression cannot be quantified");
  local_48.px_ = (error_info_container *)0x0;
  pcStack_40 = (char *)0x0;
  local_38 = (char *)0x0;
  local_30._0_4_ = -1;
  local_30._4_4_ = -1;
  local_60[0] = &PTR__regex_error_00193398;
  local_50 = &PTR__regex_error_001933c0;
  local_28 = error_badrepeat;
  local_20.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O3/KWStyle/Utilities/boost/xpressive/detail/dynamic/dynamic.hpp"
  ;
  local_20.function_ =
       "void boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::assert_word_matcher<boost::xpressive::detail::word_boundary<mpl_::bool_<true>>, boost::xpressive::regex_traits<char>>, __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::repeat_(const quant_spec &, sequence<BidiIter> &, mpl::int_<quant_none>, mpl::false_) const [Matcher = boost::xpressive::detail::assert_word_matcher<boost::xpressive::detail::word_boundary<mpl_::bool_<true>>, boost::xpressive::regex_traits<char>>, BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>]"
  ;
  local_20.line_ = 0x76;
  local_20.column_ = 0;
  throw_exception<boost::xpressive::regex_error>((regex_error *)local_60,&local_20);
}

Assistant:

void repeat_(quant_spec const &spec, sequence<BidiIter> &seq, mpl::int_<quant_none>, mpl::false_) const
    {
        if(quant_none == seq.quant())
        {
            BOOST_THROW_EXCEPTION(
                regex_error(regex_constants::error_badrepeat, "expression cannot be quantified")
            );
        }
        else
        {
            this->repeat_(spec, seq, mpl::int_<quant_variable_width>(), mpl::false_());
        }
    }